

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_entry_strmode.c
# Opt level: O3

void test_entry_strmode(void)

{
  archive_entry *entry;
  char *pcVar1;
  
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_entry_strmode.c"
                   ,L' ',(uint)(entry != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mode(entry,0x81a2);
  pcVar1 = archive_entry_strmode((archive_entry_conflict *)entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_entry_strmode.c"
             ,L'#',pcVar1,"archive_entry_strmode(entry)","-rw-r---w- ","\"-rw-r---w- \"",(void *)0x0
             ,L'\0');
  archive_entry_set_mode(entry,0x81a4);
  archive_entry_set_hardlink(entry,"link");
  pcVar1 = archive_entry_strmode((archive_entry_conflict *)entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_entry_strmode.c"
             ,L'(',pcVar1,"archive_entry_strmode(entry)","-rw-r--r-- ","\"-rw-r--r-- \"",(void *)0x0
             ,L'\0');
  archive_entry_set_mode(entry,0x1a0);
  archive_entry_set_hardlink(entry,"link");
  pcVar1 = archive_entry_strmode((archive_entry_conflict *)entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_entry_strmode.c"
             ,L',',pcVar1,"archive_entry_strmode(entry)","hrw-r----- ","\"hrw-r----- \"",(void *)0x0
             ,L'\0');
  archive_entry_set_hardlink(entry,(char *)0x0);
  archive_entry_set_mode(entry,0x41ff);
  pcVar1 = archive_entry_strmode((archive_entry_conflict *)entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_entry_strmode.c"
             ,L'0',pcVar1,"archive_entry_strmode(entry)","drwxrwxrwx ","\"drwxrwxrwx \"",(void *)0x0
             ,L'\0');
  archive_entry_set_mode(entry,0x67a2);
  pcVar1 = archive_entry_strmode((archive_entry_conflict *)entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_entry_strmode.c"
             ,L'3',pcVar1,"archive_entry_strmode(entry)","brw-r-S-wT ","\"brw-r-S-wT \"",(void *)0x0
             ,L'\0');
  archive_entry_set_mode(entry,0x2bff);
  pcVar1 = archive_entry_strmode((archive_entry_conflict *)entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_entry_strmode.c"
             ,L'6',pcVar1,"archive_entry_strmode(entry)","crwsrwxrwt ","\"crwsrwxrwt \"",(void *)0x0
             ,L'\0');
  archive_entry_set_mode(entry,0xc092);
  pcVar1 = archive_entry_strmode((archive_entry_conflict *)entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_entry_strmode.c"
             ,L'9',pcVar1,"archive_entry_strmode(entry)","s-w--w--w- ","\"s-w--w--w- \"",(void *)0x0
             ,L'\0');
  archive_entry_set_mode(entry,0x1124);
  pcVar1 = archive_entry_strmode((archive_entry_conflict *)entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_entry_strmode.c"
             ,L'<',pcVar1,"archive_entry_strmode(entry)","pr--r--r-- ","\"pr--r--r-- \"",(void *)0x0
             ,L'\0');
  archive_entry_set_mode(entry,0xa800);
  pcVar1 = archive_entry_strmode((archive_entry_conflict *)entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_entry_strmode.c"
             ,L'?',pcVar1,"archive_entry_strmode(entry)","l--S------ ","\"l--S------ \"",(void *)0x0
             ,L'\0');
  archive_entry_acl_add_entry(entry,L'Ā',L'\a',L'✓',L'N',"group78");
  pcVar1 = archive_entry_strmode((archive_entry_conflict *)entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_entry_strmode.c"
             ,L'C',pcVar1,"archive_entry_strmode(entry)","l--S------+","\"l--S------+\"",(void *)0x0
             ,L'\0');
  archive_entry_free(entry);
  return;
}

Assistant:

DEFINE_TEST(test_entry_strmode)
{
	struct archive_entry *entry;

	assert((entry = archive_entry_new()) != NULL);

	archive_entry_set_mode(entry, AE_IFREG | 0642);
	assertEqualString(archive_entry_strmode(entry), "-rw-r---w- ");

	/* Regular file + hardlink still shows as regular file. */
	archive_entry_set_mode(entry, AE_IFREG | 0644);
	archive_entry_set_hardlink(entry, "link");
	assertEqualString(archive_entry_strmode(entry), "-rw-r--r-- ");

	archive_entry_set_mode(entry, 0640);
	archive_entry_set_hardlink(entry, "link");
	assertEqualString(archive_entry_strmode(entry), "hrw-r----- ");
	archive_entry_set_hardlink(entry, NULL);

	archive_entry_set_mode(entry, AE_IFDIR | 0777);
	assertEqualString(archive_entry_strmode(entry), "drwxrwxrwx ");

	archive_entry_set_mode(entry, AE_IFBLK | 03642);
	assertEqualString(archive_entry_strmode(entry), "brw-r-S-wT ");

	archive_entry_set_mode(entry, AE_IFCHR | 05777);
	assertEqualString(archive_entry_strmode(entry), "crwsrwxrwt ");

	archive_entry_set_mode(entry, AE_IFSOCK | 0222);
	assertEqualString(archive_entry_strmode(entry), "s-w--w--w- ");

	archive_entry_set_mode(entry, AE_IFIFO | 0444);
	assertEqualString(archive_entry_strmode(entry), "pr--r--r-- ");

	archive_entry_set_mode(entry, AE_IFLNK | 04000);
	assertEqualString(archive_entry_strmode(entry), "l--S------ ");

	archive_entry_acl_add_entry(entry, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
	    0007, ARCHIVE_ENTRY_ACL_GROUP, 78, "group78");
	assertEqualString(archive_entry_strmode(entry), "l--S------+");

	/* Release the experimental entry. */
	archive_entry_free(entry);
}